

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fpu_helper.c
# Opt level: O3

void helper_fucomi_ST0_FT0_x86_64(CPUX86State *env)

{
  undefined8 uVar1;
  undefined2 uVar2;
  undefined2 uVar3;
  int iVar4;
  uint32_t uVar5;
  floatx80 a;
  floatx80 b;
  
  uVar1 = (env->ft0).low;
  uVar2 = (env->ft0).high;
  uVar3 = *(undefined2 *)&(env->ft0).field_0xa;
  b._10_2_ = uVar3;
  b.high = uVar2;
  b.low = uVar1;
  a._8_4_ = *(undefined4 *)((long)env->fpregs + (ulong)env->fpstt * 0x10 + 8);
  a.low = env->fpregs[env->fpstt].d.low;
  a._12_4_ = 0;
  b._12_4_ = 0;
  iVar4 = floatx80_compare_quiet_x86_64(a,b,&env->fp_status);
  uVar5 = cpu_cc_compute_all_x86_64(env,env->cc_op);
  env->cc_src = (long)fcomi_ccval[(long)iVar4 + 1] | (long)(int)uVar5 & 0xffffffffffffffbaU;
  return;
}

Assistant:

void helper_fucomi_ST0_FT0(CPUX86State *env)
{
    int eflags;
    int ret;

    ret = floatx80_compare_quiet(ST0, FT0, &env->fp_status);
    eflags = cpu_cc_compute_all(env, CC_OP);
    eflags = (eflags & ~(CC_Z | CC_P | CC_C)) | fcomi_ccval[ret + 1];
    CC_SRC = eflags;
}